

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

ptrdiff_t __thiscall
google::protobuf::io::EpsCopyOutputStream::GetSize(EpsCopyOutputStream *this,uint8 *ptr)

{
  long in_RSI;
  long *in_RDI;
  
  return (*in_RDI + 0x10) - in_RSI;
}

Assistant:

std::ptrdiff_t GetSize(uint8* ptr) const {
    GOOGLE_DCHECK(ptr <= end_ + kSlopBytes);  // NOLINT
    return end_ + kSlopBytes - ptr;
  }